

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

void __thiscall CLI::Option::run_callback(Option *this)

{
  MultiOptionPolicy MVar1;
  int iVar2;
  pointer pfVar3;
  pointer pbVar4;
  pointer pcVar5;
  bool bVar6;
  ValidationError *this_00;
  ConversionError *this_01;
  ArgumentMismatch *this_02;
  undefined8 uVar7;
  string *in_RCX;
  Option *unaff_RBP;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  pointer pfVar9;
  pointer unaff_R14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string err_msg;
  results_t partial_result;
  allocator_type local_189;
  undefined1 local_188 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  pointer local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  undefined1 local_e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->validators_).
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->validators_).
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    unaff_R14 = (this->results_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_150 = (this->results_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (unaff_R14 != local_150) {
      do {
        pfVar3 = (this->validators_).
                 super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pfVar9 = (this->validators_).
                      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pfVar9 != pfVar3;
            pfVar9 = pfVar9 + 0x20) {
          if (*(long *)(pfVar9 + 0x10) == 0) {
            ::std::__throw_bad_function_call();
LAB_00121893:
            this_00 = (ValidationError *)__cxa_allocate_exception(0x38);
            single_name_abi_cxx11_(&local_50,this);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,local_188._0_8_,
                       (pointer)(local_188._0_8_ + local_188._8_8_));
            ValidationError::ValidationError(this_00,&local_50,&local_b0);
            __cxa_throw(this_00,&ValidationError::typeinfo,Error::~Error);
          }
          (**(code **)(pfVar9 + 0x18))(local_188,pfVar9,unaff_R14);
          if (local_188._8_8_ != 0) goto LAB_00121893;
          if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_);
          }
        }
        unaff_R14 = unaff_R14 + 1;
        unaff_RBP = this;
      } while (unaff_R14 != local_150);
    }
  }
  MVar1 = (this->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar1 != Join) {
    if (MVar1 == TakeFirst) {
      pbVar4 = (this->results_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->results_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == pbVar4) {
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0012198e:
        this_02 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        single_name_abi_cxx11_(&local_70,this);
        ArgumentMismatch::ArgumentMismatch
                  (this_02,&local_70,this->expected_,
                   (long)(this->results_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->results_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(this_02,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      unaff_R14 = (pointer)(local_188 + 0x10);
      pcVar5 = (pbVar4->_M_dataplus)._M_p;
      local_188._0_8_ = unaff_R14;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_188,pcVar5,pcVar5 + pbVar4->_M_string_length);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_188;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_168,__l_00,&local_189);
      if ((pointer)local_188._0_8_ != unaff_R14) {
        operator_delete((void *)local_188._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_118,&local_168);
      if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        bVar6 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&local_118);
        pvVar8 = &local_118;
        goto LAB_001217df;
      }
    }
    else {
      if (MVar1 == TakeLast) {
        pbVar4 = (this->results_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        unaff_R14 = (pointer)(local_188 + 0x10);
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        local_188._0_8_ = unaff_R14;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
        __l._M_len = 1;
        __l._M_array = (iterator)local_188;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_168,__l,&local_189);
        if ((pointer)local_188._0_8_ != unaff_R14) {
          operator_delete((void *)local_188._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_100,&local_168);
        if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
          bVar6 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&local_100);
          pvVar8 = &local_100;
          goto LAB_001217df;
        }
      }
      else {
        iVar2 = this->expected_;
        if (((0 < (long)iVar2) &&
            ((long)(this->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5 != (long)iVar2)) ||
           ((iVar2 < 0 &&
            ((ulong)((long)(this->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) < (ulong)(uint)-iVar2))))
        goto LAB_0012198e;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_148,&this->results_);
        if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
          bVar6 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&local_148);
          pvVar8 = &local_148;
          goto LAB_0012186e;
        }
        ::std::__throw_bad_function_call();
      }
      ::std::__throw_bad_function_call();
    }
    ::std::__throw_bad_function_call();
LAB_00121a01:
    uVar7 = ::std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((char)unaff_RBP != '\0') {
      __cxa_free_exception(unaff_R14);
    }
    _Unwind_Resume(uVar7);
  }
  unaff_R14 = (pointer)(local_e8 + 0x10);
  local_e8._0_8_ = unaff_R14;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"\n","");
  detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_188,(detail *)&this->results_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8,in_RCX);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_188;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l_01,&local_189);
  if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
    operator_delete((void *)local_188._0_8_);
  }
  if ((pointer)local_e8._0_8_ != unaff_R14) {
    operator_delete((void *)local_e8._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_130,&local_168);
  if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_00121a01;
  bVar6 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&local_130);
  pvVar8 = &local_130;
LAB_001217df:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar8);
  pvVar8 = &local_168;
LAB_0012186e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar8);
  if (bVar6 != false) {
    return;
  }
  this_01 = (ConversionError *)__cxa_allocate_exception(0x38);
  get_name_abi_cxx11_(&local_90,this,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,&this->results_);
  ConversionError::ConversionError(this_01,&local_90,&local_c8);
  __cxa_throw(this_01,&ConversionError::typeinfo,Error::~Error);
}

Assistant:

void run_callback() {

        // Run the validators (can change the string)
        if(!validators_.empty()) {
            for(std::string &result : results_)
                for(const std::function<std::string(std::string &)> &vali : validators_) {
                    std::string err_msg = vali(result);
                    if(!err_msg.empty())
                        throw ValidationError(single_name(), err_msg);
                }
        }

        bool local_result;

        // Operation depends on the policy setting
        if(multi_option_policy_ == MultiOptionPolicy::TakeLast) {
            results_t partial_result = {results_.back()};
            local_result = !callback_(partial_result);
        } else if(multi_option_policy_ == MultiOptionPolicy::TakeFirst) {
            results_t partial_result = {results_.at(0)};
            local_result = !callback_(partial_result);
        } else if(multi_option_policy_ == MultiOptionPolicy::Join) {
            results_t partial_result = {detail::join(results_, "\n")};
            local_result = !callback_(partial_result);
        } else {
            if((expected_ > 0 && results_.size() != static_cast<size_t>(expected_)) ||
               (expected_ < 0 && results_.size() < static_cast<size_t>(-expected_)))
                throw ArgumentMismatch(single_name(), expected_, results_.size());
            else
                local_result = !callback_(results_);
        }

        if(local_result)
            throw ConversionError(get_name(), results_);
    }